

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProto3OptionalSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  FileDescriptor *this_00;
  bool bVar2;
  Edition EVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  
  if ((supported_features & 1) == 0) {
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar7 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar1;
        ppFVar7 = ppFVar7 + 1) {
      this_00 = *ppFVar7;
      EVar3 = FileDescriptor::edition(this_00);
      if ((EVar3 == EDITION_PROTO3) && (0 < this_00->message_type_count_)) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          bVar2 = anon_unknown_5::ContainsProto3Optional
                            ((Descriptor *)(&this_00->message_types_->super_SymbolBase + lVar6));
          if (bVar2) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(this_00->name_->_M_dataplus)._M_p,
                                this_00->name_->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,
                       ": is a proto3 file that contains optional fields, but code generator ",0x45)
            ;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(codegen_name->_M_dataplus)._M_p,
                                codegen_name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,
                       " hasn\'t been updated to support optional fields in proto3. Please ask the owner of this code generator to support proto3 optional."
                       ,0x82);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            return false;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0xa0;
        } while (lVar5 < this_00->message_type_count_);
      }
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProto3OptionalSupport(
    const std::string& codegen_name, uint64_t supported_features,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  bool supports_proto3_optional =
      supported_features & CodeGenerator::FEATURE_PROTO3_OPTIONAL;
  if (!supports_proto3_optional) {
    for (const auto fd : parsed_files) {
      if (ContainsProto3Optional(
              ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd), fd)) {
        std::cerr << fd->name()
                  << ": is a proto3 file that contains optional fields, but "
                     "code generator "
                  << codegen_name
                  << " hasn't been updated to support optional fields in "
                     "proto3. Please ask the owner of this code generator to "
                     "support proto3 optional."
                  << std::endl;
        return false;
      }
    }
  }
  return true;
}